

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PacketAllocator.h
# Opt level: O1

bool __thiscall
pktalloc::LightVector<SiameseOriginalPacket,_25U>::SetSize_NoCopy
          (LightVector<SiameseOriginalPacket,_25U> *this,uint elements)

{
  LightVector<SiameseOriginalPacket,_25U> *pLVar1;
  bool bVar2;
  SiameseOriginalPacket *pSVar3;
  uint uVar4;
  
  if (this->Allocated < elements) {
    uVar4 = elements * 3 >> 1;
    pSVar3 = (SiameseOriginalPacket *)operator_new__((ulong)uVar4 << 4,(nothrow_t *)&std::nothrow);
    if (pSVar3 != (SiameseOriginalPacket *)0x0) {
      pLVar1 = (LightVector<SiameseOriginalPacket,_25U> *)this->DataPtr;
      this->Allocated = uVar4;
      this->DataPtr = pSVar3;
      if (pLVar1 != (LightVector<SiameseOriginalPacket,_25U> *)0x0 && pLVar1 != this) {
        operator_delete__(pLVar1);
      }
      if (pSVar3 != (SiameseOriginalPacket *)0x0) goto LAB_0016bd3e;
    }
    bVar2 = false;
  }
  else {
LAB_0016bd3e:
    this->Size = elements;
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool SetSize_NoCopy(unsigned elements)
    {
        PKTALLOC_DEBUG_ASSERT(Size <= Allocated);

        // If it is actually expanding, and it needs to grow:
        if (elements > Allocated)
        {
            const unsigned newAllocated = (elements * 3) / 2;
            T* newData = new(std::nothrow) T[newAllocated];
            if (!newData)
                return false;
            T* oldData = DataPtr;
            Allocated  = newAllocated;
            DataPtr    = newData;

            // Delete old data without copying
            if (oldData != &PreallocatedData[0]) {
                delete[] oldData;
            }
        }

        Size = elements;
        return true;
    }